

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3pBufferDataUploadTests.cpp
# Opt level: O0

int __thiscall
deqp::gles3::Performance::anon_unknown_1::ReferenceMemcpyCase::init
          (ReferenceMemcpyCase *this,EVP_PKEY_CTX *ctx)

{
  int iVar1;
  TestLog *this_00;
  MessageBuilder *this_01;
  EVP_PKEY_CTX *ctx_00;
  value_type_conflict4 local_19d [13];
  MessageBuilder local_190;
  ReferenceMemcpyCase *local_10;
  ReferenceMemcpyCase *this_local;
  
  local_10 = this;
  this_00 = tcu::TestContext::getLog
                      ((this->
                       super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                       ).
                       super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                       .super_TestCase.super_TestCase.super_TestNode.m_testCtx);
  tcu::TestLog::operator<<(&local_190,this_00,(BeginMessageToken *)&tcu::TestLog::Message);
  this_01 = tcu::MessageBuilder::operator<<
                      (&local_190,(char (*) [33])"Testing performance of memcpy().");
  tcu::MessageBuilder::operator<<(this_01,(EndMessageToken *)&tcu::TestLog::EndMessage);
  tcu::MessageBuilder::~MessageBuilder(&local_190);
  ctx_00 = (EVP_PKEY_CTX *)
           (long)(this->
                 super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ).
                 super_BasicBufferCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 .m_bufferSizeMax;
  local_19d[0] = '\0';
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize
            (&this->m_dstBuf,(size_type)ctx_00,local_19d);
  iVar1 = BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
          ::init(&this->
                  super_BasicUploadCase<deqp::gles3::Performance::(anonymous_namespace)::SingleOperationDuration>
                 ,ctx_00);
  return iVar1;
}

Assistant:

void ReferenceMemcpyCase::init (void)
{
	// Describe what the test tries to do
	m_testCtx.getLog() << tcu::TestLog::Message << "Testing performance of memcpy()." << tcu::TestLog::EndMessage;

	m_dstBuf.resize(m_bufferSizeMax, 0x00);

	BasicUploadCase<SingleOperationDuration>::init();
}